

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O1

void __thiscall i2p::sam::Session::CreateIfNotCreatedAlready(Session *this)

{
  CService *this_00;
  Sock *pSVar1;
  pointer puVar2;
  string_view source_file;
  string_view source_file_00;
  string str;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  long lVar6;
  undefined8 uVar7;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  long in_FS_OFFSET;
  Span<unsigned_char> bytes;
  Span<const_unsigned_char> input;
  string_view str_00;
  string_view str_01;
  string_view logging_function;
  string_view logging_function_00;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  char *session_type;
  string log_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> session_id;
  string errmsg;
  uint256 hash;
  undefined8 in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  allocator<char> local_261;
  undefined1 local_260 [56];
  long *local_228;
  long local_218 [2];
  Reply local_208;
  direct_or_indirect local_190;
  Network local_180;
  uint32_t uStack_17c;
  long local_178;
  uint16_t local_170;
  undefined6 uStack_16e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_150;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 *local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  undefined7 uStack_c7;
  Binary local_98;
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d0 = 0;
  local_c8 = 0;
  pSVar1 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  local_d8 = &local_c8;
  if ((pSVar1 != (Sock *)0x0) &&
     (iVar4 = (*pSVar1->_vptr_Sock[0x13])(pSVar1,&local_d8), (char)iVar4 != '\0'))
  goto LAB_004866e2;
  local_260._8_8_ = "persistent";
  if (this->m_transient != false) {
    local_260._8_8_ = "transient";
  }
  local_48._M_allocated_capacity = 0;
  local_48._8_8_ = 0;
  local_58._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_58._8_8_ = (char *)0x0;
  bytes.m_size = 0x20;
  bytes.m_data = local_58;
  GetRandBytes(bytes);
  base_blob<256u>::GetHex_abi_cxx11_((string *)&local_190.indirect_contents,local_58);
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xa;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &local_190.indirect_contents,0,10);
  if ((Network *)local_190.indirect_contents.indirect != &local_180) {
    operator_delete(local_190.indirect_contents.indirect,CONCAT44(uStack_17c,local_180) + 1);
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,I2P,Debug);
  if (bVar3) {
    Proxy::ToString_abi_cxx11_(&local_118,&this->m_control_host);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      local_190._8_8_ = (Network *)0x0;
      local_180 = local_180 & 0xffffff00;
      local_190.indirect_contents.indirect = (char *)&local_180;
      tinyformat::format<char_const*,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"Creating %s SAM session %s with %s\n",
                 local_260 + 8,(char **)&local_f8,&local_118,in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_190.indirect_contents,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_58._0_8_ = &DAT_00000050;
      local_58._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      in_stack_fffffffffffffd78 = 0x50;
      in_stack_fffffffffffffd80 =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      in_stack_fffffffffffffd90 = 1;
      in_stack_fffffffffffffd88 = 0x400000;
      in_R9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1a1;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file._M_len = 0x50;
      str_00._M_str = local_190.indirect_contents.indirect;
      str_00._M_len = local_190._8_8_;
      logging_function._M_str = "CreateIfNotCreatedAlready";
      logging_function._M_len = 0x19;
      in_R8 = "CreateIfNotCreatedAlready";
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x19;
      BCLog::Logger::LogPrintStr(pLVar5,str_00,logging_function,source_file,0x1a1,I2P,Debug);
      if ((Network *)local_190.indirect_contents.indirect != &local_180) {
        operator_delete(local_190.indirect_contents.indirect,CONCAT44(uStack_17c,local_180) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
  }
  Hello((Session *)local_260);
  uVar7 = local_260._0_8_;
  if (this->m_transient == true) {
    tinyformat::format<std::__cxx11::string>
              ((string *)local_58,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1"
               ,(char *)&local_f8,args);
    SendRequestAndGetReply
              ((Reply *)&local_190.indirect_contents,this,(Sock *)uVar7,(string *)local_58,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    }
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"DESTINATION","");
    Reply::Get((string *)local_58,(Reply *)&local_190.indirect_contents,&local_78);
    DecodeI2PBase64(&local_98,(string *)local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&this->m_private_key,&local_98);
    if (local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_98.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_98.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(uStack_16e,local_170) != &local_160) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT62(uStack_16e,local_170),local_160._M_allocated_capacity + 1);
    }
    if ((Network *)local_190.indirect_contents.indirect != &local_180) {
      lVar6 = CONCAT44(uStack_17c,local_180);
      uVar7 = local_190.indirect_contents.indirect;
LAB_004864d7:
      operator_delete((void *)uVar7,lVar6 + 1);
    }
  }
  else {
    ReadBinaryFile_abi_cxx11_
              ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_190.indirect_contents,&this->m_private_key_file,0xffffffffffffffff);
    if (local_190.direct[0] == '\x01') {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_private_key,
                 local_190._8_8_,CONCAT44(uStack_17c,local_180) + local_190._8_8_);
    }
    else {
      GenerateAndSavePrivateKey(this,(Sock *)local_260._0_8_);
    }
    puVar2 = (this->m_private_key).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
             ._M_impl.super__Vector_impl_data._M_start;
    input.m_size = (long)(this->m_private_key).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar2;
    input.m_data = puVar2;
    EncodeBase64_abi_cxx11_(&local_78,input);
    SwapBase64((string *)local_58,&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    uVar7 = local_260._0_8_;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_78,
               (tinyformat *)
               "SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3"
               ,(char *)&local_f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_R8);
    SendRequestAndGetReply(&local_208,this,(Sock *)uVar7,&local_78,true);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_208.keys._M_h);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.request._M_dataplus._M_p != &local_208.request.field_2) {
      operator_delete(local_208.request._M_dataplus._M_p,
                      local_208.request.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208.full._M_dataplus._M_p != &local_208.full.field_2) {
      operator_delete(local_208.full._M_dataplus._M_p,
                      local_208.full.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._0_8_ != &local_48) {
      operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
    }
    lVar6 = local_178;
    uVar7 = local_190._8_8_;
    if ((long *)local_190._8_8_ != &local_178) goto LAB_004864d7;
  }
  MyDestination((Binary *)&local_78,this);
  DestBinToAddr((CNetAddr *)local_58,(Binary *)&local_78);
  CService::CService((CService *)&local_190.indirect_contents,(CNetAddr *)local_58,0);
  this_00 = &this->m_my_addr;
  if (0x10 < (this->m_my_addr).super_CNetAddr.m_addr._size) {
    free((this_00->super_CNetAddr).m_addr._union.indirect_contents.indirect);
  }
  (this_00->super_CNetAddr).m_addr._union.indirect_contents.indirect =
       local_190.indirect_contents.indirect;
  *(undefined8 *)((long)&(this->m_my_addr).super_CNetAddr.m_addr._union + 8) = local_190._8_8_;
  (this->m_my_addr).super_CNetAddr.m_addr._size = local_180;
  local_180 = NET_UNROUTABLE;
  (this->m_my_addr).super_CNetAddr.m_net = (undefined4)local_178;
  (this->m_my_addr).super_CNetAddr.m_scope_id = local_178._4_4_;
  (this->m_my_addr).port = local_170;
  if (0x10 < (uint)local_48._M_allocated_capacity._0_4_) {
    free((void *)local_58._0_8_);
    local_58._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_78._M_dataplus._M_p,
                    local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->m_session_id,&local_f8);
  uVar7 = local_260._0_8_;
  local_260._0_8_ = (Sock *)0x0;
  pSVar1 = (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
           super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.
           super__Head_base<0UL,_Sock_*,_false>._M_head_impl;
  (this->m_control_sock)._M_t.super___uniq_ptr_impl<Sock,_std::default_delete<Sock>_>._M_t.
  super__Tuple_impl<0UL,_Sock_*,_std::default_delete<Sock>_>.super__Head_base<0UL,_Sock_*,_false>.
  _M_head_impl = (Sock *)uVar7;
  if (pSVar1 != (Sock *)0x0) {
    (*pSVar1->_vptr_Sock[1])();
  }
  pLVar5 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(pLVar5,I2P,Info);
  if (bVar3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_228,(char *)local_260._8_8_,&local_261);
    str._M_string_length = (size_type)in_stack_fffffffffffffd80;
    str._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd78;
    str.field_2._M_allocated_capacity = in_stack_fffffffffffffd88;
    str.field_2._8_4_ = in_stack_fffffffffffffd90;
    str.field_2._12_4_ = in_stack_fffffffffffffd94;
    Capitalize(&local_118,str);
    CService::ToStringAddrPort_abi_cxx11_((string *)(local_260 + 0x18),this_00);
    pLVar5 = LogInstance();
    bVar3 = BCLog::Logger::Enabled(pLVar5);
    if (bVar3) {
      local_190._8_8_ = (Network *)0x0;
      local_180 = local_180 & 0xffffff00;
      local_190.indirect_contents.indirect = (char *)&local_180;
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                ((string *)local_58,(tinyformat *)"%s SAM session %s created, my address=%s\n",
                 (char *)&local_118,&this->m_session_id,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_260 + 0x18),in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &local_190.indirect_contents,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._0_8_ != &local_48) {
        operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
      }
      pLVar5 = LogInstance();
      local_58._0_8_ = &DAT_00000050;
      local_58._8_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/i2p.cpp";
      source_file_00._M_len = 0x50;
      str_01._M_str = local_190.indirect_contents.indirect;
      str_01._M_len = local_190._8_8_;
      logging_function_00._M_str = "CreateIfNotCreatedAlready";
      logging_function_00._M_len = 0x19;
      BCLog::Logger::LogPrintStr(pLVar5,str_01,logging_function_00,source_file_00,0x1c9,I2P,Info);
      if ((Network *)local_190.indirect_contents.indirect != &local_180) {
        operator_delete(local_190.indirect_contents.indirect,CONCAT44(uStack_17c,local_180) + 1);
      }
    }
    if ((undefined1 *)local_260._24_8_ != local_260 + 0x28) {
      operator_delete((void *)local_260._24_8_,(ulong)(local_260._40_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if (local_228 != local_218) {
      operator_delete(local_228,local_218[0] + 1);
    }
  }
  if ((Sock *)local_260._0_8_ != (Sock *)0x0) {
    (**(code **)(*(long *)local_260._0_8_ + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
LAB_004866e2:
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,CONCAT71(uStack_c7,local_c8) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::CreateIfNotCreatedAlready()
{
    std::string errmsg;
    if (m_control_sock && m_control_sock->IsConnected(errmsg)) {
        return;
    }

    const auto session_type = m_transient ? "transient" : "persistent";
    const auto session_id = GetRandHash().GetHex().substr(0, 10); // full is overkill, too verbose in the logs

    LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Creating %s SAM session %s with %s\n", session_type, session_id, m_control_host.ToString());

    auto sock = Hello();

    if (m_transient) {
        // The destination (private key) is generated upon session creation and returned
        // in the reply in DESTINATION=.
        const Reply& reply = SendRequestAndGetReply(
            *sock,
            strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 "
                      "i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1",
                      session_id));

        m_private_key = DecodeI2PBase64(reply.Get("DESTINATION"));
    } else {
        // Read our persistent destination (private key) from disk or generate
        // one and save it to disk. Then use it when creating the session.
        const auto& [read_ok, data] = ReadBinaryFile(m_private_key_file);
        if (read_ok) {
            m_private_key.assign(data.begin(), data.end());
        } else {
            GenerateAndSavePrivateKey(*sock);
        }

        const std::string& private_key_b64 = SwapBase64(EncodeBase64(m_private_key));

        SendRequestAndGetReply(*sock,
                               strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s "
                                         "i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3",
                                         session_id,
                                         private_key_b64));
    }

    m_my_addr = CService(DestBinToAddr(MyDestination()), I2P_SAM31_PORT);
    m_session_id = session_id;
    m_control_sock = std::move(sock);

    LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "%s SAM session %s created, my address=%s\n",
        Capitalize(session_type),
        m_session_id,
        m_my_addr.ToStringAddrPort());
}